

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charpoly.h
# Opt level: O3

void charpoly_danilevsky_piv<Eigen::Matrix<double,11,11,0,11,11>>
               (MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *A,double *p)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Transpose<Eigen::Matrix<double,_1,_11,_1,_1,_11>_> __ptr;
  uint uVar6;
  Index size;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  void *__dest;
  ulong uVar11;
  undefined8 *puVar12;
  DstEvaluatorType dstEvaluator;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *pMVar13;
  Index index;
  double dVar14;
  ulong uVar15;
  ulong uVar16;
  ActualDstType actualDst;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *pMVar17;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *pMVar18;
  ulong uVar19;
  double dVar20;
  long lVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  VectorXd v;
  VectorXd vinv;
  double *local_108;
  double dStack_100;
  long local_f0;
  Transpose<Eigen::Matrix<double,_1,_11,_1,_1,_11>_> local_e8;
  ulong local_e0;
  double local_d8;
  undefined8 uStack_d0;
  Matrix<double,_1,_11,_1,_1,_11> local_c8;
  double *local_70;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *local_68;
  long local_60;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *local_58;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *local_50;
  Scalar local_48;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_40;
  Transpose<const_Eigen::Matrix<double,_11,_11,_0,_11,_11>_> local_38;
  
  local_68 = A + 0x318;
  pMVar17 = A + 0x50;
  uVar16 = 0xb;
  dVar20 = 4.44659081257122e-323;
  lVar21 = 10;
  local_f0 = 0;
  local_70 = p;
  do {
    uVar11 = uVar16 - 2;
    pMVar18 = A + uVar11 * 0x58;
    dVar26 = *(double *)(pMVar18 + lVar21 * 8);
    if (uVar16 < 3) {
      uVar6 = (uint)uVar11;
    }
    else {
      uVar22 = SUB84(ABS(dVar26),0);
      uVar23 = (undefined4)((ulong)ABS(dVar26) >> 0x20);
      dVar14 = 0.0;
      uVar7 = uVar11 & 0xffffffff;
      pMVar13 = pMVar17;
      do {
        dVar24 = ABS(*(double *)pMVar13);
        bVar2 = dVar24 != (double)CONCAT44(uVar23,uVar22);
        bVar3 = (double)CONCAT44(uVar23,uVar22) <= dVar24;
        if (dVar24 <= (double)CONCAT44(uVar23,uVar22)) {
          dVar24 = (double)CONCAT44(uVar23,uVar22);
        }
        if (bVar3 && bVar2) {
          uVar7 = (ulong)dVar14 & 0xffffffff;
        }
        uVar6 = (uint)uVar7;
        dVar14 = (double)((long)dVar14 + 1);
        pMVar13 = pMVar13 + 0x58;
        uVar22 = SUB84(dVar24,0);
        uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
      } while (dVar20 != dVar14);
    }
    uVar7 = (ulong)uVar6;
    if (uVar11 != uVar7) {
      if (10 < uVar6) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, 11, 11>, 1, 11>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 11, 11>, BlockRows = 1, BlockCols = 11, InnerPanel = false]"
                     );
      }
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + -0x10);
      *(undefined8 *)(A + uVar16 * 8 + -0x10) = *(undefined8 *)(A + uVar7 * 8);
      *(undefined8 *)(A + uVar7 * 8) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0x48);
      *(undefined8 *)(A + uVar16 * 8 + 0x48) = *(undefined8 *)(A + uVar7 * 8 + 0x58);
      *(undefined8 *)(A + uVar7 * 8 + 0x58) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0xa0);
      *(undefined8 *)(A + uVar16 * 8 + 0xa0) = *(undefined8 *)(A + uVar7 * 8 + 0xb0);
      *(undefined8 *)(A + uVar7 * 8 + 0xb0) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0xf8);
      *(undefined8 *)(A + uVar16 * 8 + 0xf8) = *(undefined8 *)(A + uVar7 * 8 + 0x108);
      *(undefined8 *)(A + uVar7 * 8 + 0x108) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0x150);
      *(undefined8 *)(A + uVar16 * 8 + 0x150) = *(undefined8 *)(A + uVar7 * 8 + 0x160);
      *(undefined8 *)(A + uVar7 * 8 + 0x160) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0x1a8);
      *(undefined8 *)(A + uVar16 * 8 + 0x1a8) = *(undefined8 *)(A + uVar7 * 8 + 0x1b8);
      *(undefined8 *)(A + uVar7 * 8 + 0x1b8) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0x200);
      *(undefined8 *)(A + uVar16 * 8 + 0x200) = *(undefined8 *)(A + uVar7 * 8 + 0x210);
      *(undefined8 *)(A + uVar7 * 8 + 0x210) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 600);
      *(undefined8 *)(A + uVar16 * 8 + 600) = *(undefined8 *)(A + uVar7 * 8 + 0x268);
      *(undefined8 *)(A + uVar7 * 8 + 0x268) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0x2b0);
      *(undefined8 *)(A + uVar16 * 8 + 0x2b0) = *(undefined8 *)(A + uVar7 * 8 + 0x2c0);
      *(undefined8 *)(A + uVar7 * 8 + 0x2c0) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0x308);
      *(undefined8 *)(A + uVar16 * 8 + 0x308) = *(undefined8 *)(A + uVar7 * 8 + 0x318);
      *(undefined8 *)(A + uVar7 * 8 + 0x318) = uVar1;
      uVar1 = *(undefined8 *)(A + uVar16 * 8 + 0x360);
      *(undefined8 *)(A + uVar16 * 8 + 0x360) = *(undefined8 *)(A + uVar7 * 8 + 0x370);
      *(undefined8 *)(A + uVar7 * 8 + 0x370) = uVar1;
      lVar8 = uVar7 * 0x58;
      uVar1 = *(undefined8 *)(A + lVar8);
      uVar4 = *(undefined8 *)(A + lVar8 + 8);
      uVar5 = *(undefined8 *)(pMVar18 + 8);
      *(undefined8 *)(A + lVar8) = *(undefined8 *)pMVar18;
      *(undefined8 *)(A + lVar8 + 8) = uVar5;
      *(undefined8 *)pMVar18 = uVar1;
      *(undefined8 *)(pMVar18 + 8) = uVar4;
      uVar1 = *(undefined8 *)(A + lVar8 + 0x10);
      uVar4 = *(undefined8 *)(A + lVar8 + 0x10 + 8);
      uVar5 = *(undefined8 *)(pMVar18 + 0x18);
      *(undefined8 *)(A + lVar8 + 0x10) = *(undefined8 *)(pMVar18 + 0x10);
      *(undefined8 *)(A + lVar8 + 0x10 + 8) = uVar5;
      *(undefined8 *)(pMVar18 + 0x10) = uVar1;
      *(undefined8 *)(pMVar18 + 0x18) = uVar4;
      uVar1 = *(undefined8 *)(A + lVar8 + 0x20);
      uVar4 = *(undefined8 *)(A + lVar8 + 0x20 + 8);
      uVar5 = *(undefined8 *)(pMVar18 + 0x28);
      *(undefined8 *)(A + lVar8 + 0x20) = *(undefined8 *)(pMVar18 + 0x20);
      *(undefined8 *)(A + lVar8 + 0x20 + 8) = uVar5;
      *(undefined8 *)(pMVar18 + 0x20) = uVar1;
      *(undefined8 *)(pMVar18 + 0x28) = uVar4;
      uVar1 = *(undefined8 *)(A + lVar8 + 0x30);
      uVar4 = *(undefined8 *)(A + lVar8 + 0x30 + 8);
      uVar5 = *(undefined8 *)(pMVar18 + 0x38);
      *(undefined8 *)(A + lVar8 + 0x30) = *(undefined8 *)(pMVar18 + 0x30);
      *(undefined8 *)(A + lVar8 + 0x30 + 8) = uVar5;
      *(undefined8 *)(pMVar18 + 0x30) = uVar1;
      *(undefined8 *)(pMVar18 + 0x38) = uVar4;
      uVar1 = *(undefined8 *)(A + lVar8 + 0x40);
      uVar4 = *(undefined8 *)(A + lVar8 + 0x40 + 8);
      uVar5 = *(undefined8 *)(pMVar18 + 0x48);
      *(undefined8 *)(A + lVar8 + 0x40) = *(undefined8 *)(pMVar18 + 0x40);
      *(undefined8 *)(A + lVar8 + 0x40 + 8) = uVar5;
      *(undefined8 *)(pMVar18 + 0x40) = uVar1;
      *(undefined8 *)(pMVar18 + 0x48) = uVar4;
      uVar1 = *(undefined8 *)(pMVar18 + 0x50);
      *(undefined8 *)(pMVar18 + 0x50) = *(undefined8 *)(A + lVar8 + 0x50);
      *(undefined8 *)(A + lVar8 + 0x50) = uVar1;
      dVar26 = *(double *)(pMVar18 + lVar21 * 8);
    }
    uStack_d0 = 0;
    local_108 = (double *)0x0;
    dStack_100 = 0.0;
    local_d8 = dVar26;
    local_50 = pMVar18;
    pdVar9 = (double *)malloc(0x58);
    if (((ulong)pdVar9 & 0xf) != 0) {
LAB_0015fd1c:
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar9 == (double *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = PyErr_Clear;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_58 = local_68 + local_f0 * -0x58;
    dStack_100 = 5.43472210425371e-323;
    lVar8 = 0;
    pdVar10 = pdVar9;
    do {
      *pdVar10 = *(double *)(pMVar17 + lVar8 * 8);
      lVar8 = lVar8 + 0xb;
      pdVar10 = pdVar10 + 1;
    } while (lVar8 != 0x79);
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [8] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [9] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [6] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [7] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [4] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [5] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [2] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [3] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [0] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [1] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [10] = 0.0;
    local_48 = 1.0;
    local_e8.m_matrix = &local_c8;
    local_108 = pdVar9;
    local_40.m_matrix.m_matrix = (non_const_type)(non_const_type)&local_108;
    local_38.m_matrix = (non_const_type)A;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<double,11,11,0,11,11>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::Transpose<Eigen::Matrix<double,1,11,1,1,11>>>
              (&local_38,&local_40,&local_e8,&local_48);
    *(double *)(A + uVar16 * 8 + -0x10) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[0];
    *(double *)(A + uVar16 * 8 + 0x48) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[1];
    *(double *)(A + uVar16 * 8 + 0xa0) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[2];
    *(double *)(A + uVar16 * 8 + 0xf8) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[3];
    *(double *)(A + uVar16 * 8 + 0x150) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[4];
    *(double *)(A + uVar16 * 8 + 0x1a8) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[5];
    *(double *)(A + uVar16 * 8 + 0x200) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[6];
    *(double *)(A + uVar16 * 8 + 600) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[7];
    *(double *)(A + uVar16 * 8 + 0x2b0) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[8];
    *(double *)(A + uVar16 * 8 + 0x308) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[9];
    *(double *)(A + uVar16 * 8 + 0x360) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[10];
    if ((long)dStack_100 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [1] = dStack_100;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [3] = -1.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [4] = (double)&local_108;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_c8);
    uVar7 = local_e0;
    __ptr.m_matrix = local_e8.m_matrix;
    if ((long)local_e0 <= (long)uVar11) {
LAB_0015fd3b:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.
    m_data.array[uVar16 - 2] = 1.0;
    uVar15 = local_e0 & 0x7ffffffffffffffe;
    if (1 < local_e0) {
      uVar19 = 0;
      do {
        auVar25._8_4_ = SUB84(local_d8,0);
        auVar25._0_8_ = local_d8;
        auVar25._12_4_ = (int)((ulong)local_d8 >> 0x20);
        auVar25 = divpd(*(undefined1 (*) [16])
                         (((local_e8.m_matrix)->
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.
                          m_data.array + uVar19),auVar25);
        *(undefined1 (*) [16])
         (((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
          m_storage.m_data.array + uVar19) = auVar25;
        uVar19 = uVar19 + 2;
      } while (uVar19 < uVar15);
    }
    if ((long)uVar15 < (long)local_e0) {
      do {
        ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
        m_storage.m_data.array[uVar15] =
             ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
             m_storage.m_data.array[uVar15] / local_d8;
        uVar15 = uVar15 + 1;
      } while (local_e0 != uVar15);
    }
    local_d8 = dVar20;
    local_60 = lVar21;
    if ((long)local_e0 <= (long)uVar11) goto LAB_0015fd3b;
    ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.
    m_data.array[uVar16 - 2] =
         ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
         m_storage.m_data.array[uVar16 - 2] + -1.0;
    __dest = malloc(0x58);
    if (((ulong)__dest & 0xf) != 0) goto LAB_0015fd1c;
    if (__dest == (void *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = PyErr_Clear;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    memcpy(__dest,local_58,0x50);
    lVar21 = local_60;
    *(undefined8 *)((long)__dest + 0x50) = *(undefined8 *)(local_50 + 0x50);
    uVar11 = 0;
    do {
      if (uVar7 != 0xb) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Block<Eigen::Matrix<double, 11, 11>, 1, 11>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, 11, 11>, 1, 11>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>]"
                     );
      }
      dVar20 = *(double *)((long)__dest + uVar11 * 8);
      *(double *)(A + uVar11 * 8) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[0] * dVar20 + *(double *)(A + uVar11 * 8);
      *(double *)(A + uVar11 * 8 + 0x58) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[1] * dVar20 + *(double *)(A + uVar11 * 8 + 0x58);
      *(double *)(A + uVar11 * 8 + 0xb0) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[2] * dVar20 + *(double *)(A + uVar11 * 8 + 0xb0);
      *(double *)(A + uVar11 * 8 + 0x108) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[3] * dVar20 + *(double *)(A + uVar11 * 8 + 0x108);
      *(double *)(A + uVar11 * 8 + 0x160) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[4] * dVar20 + *(double *)(A + uVar11 * 8 + 0x160);
      *(double *)(A + uVar11 * 8 + 0x1b8) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[5] * dVar20 + *(double *)(A + uVar11 * 8 + 0x1b8);
      *(double *)(A + uVar11 * 8 + 0x210) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[6] * dVar20 + *(double *)(A + uVar11 * 8 + 0x210);
      *(double *)(A + uVar11 * 8 + 0x268) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[7] * dVar20 + *(double *)(A + uVar11 * 8 + 0x268);
      *(double *)(A + uVar11 * 8 + 0x2c0) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[8] * dVar20 + *(double *)(A + uVar11 * 8 + 0x2c0);
      *(double *)(A + uVar11 * 8 + 0x318) =
           ((__ptr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[9] * dVar20 + *(double *)(A + uVar11 * 8 + 0x318);
      *(double *)(A + uVar11 * 8 + 0x370) =
           dVar20 * ((__ptr.m_matrix)->
                    super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data
                    .array[10] + *(double *)(A + uVar11 * 8 + 0x370);
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
    *(undefined8 *)(A + local_60 * 8) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x58) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0xb0) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x108) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x160) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x1b8) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x210) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x268) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x2c0) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x318) = 0;
    *(undefined8 *)(A + local_60 * 8 + 0x370) = 0;
    *(undefined8 *)(local_50 + local_60 * 8) = 0x3ff0000000000000;
    free(__dest);
    free(__ptr.m_matrix);
    free(local_108);
    lVar21 = lVar21 + -1;
    dVar20 = (double)((long)local_d8 - 1);
    local_f0 = local_f0 + 1;
    uVar16 = uVar16 - 1;
    pMVar17 = pMVar17 + -8;
    if (local_f0 == 10) {
      local_70[0xb] = 1.0;
      lVar21 = 0x6e;
      do {
        *local_70 = -*(double *)(A + lVar21 * 8);
        local_70 = local_70 + 1;
        lVar21 = lVar21 + -0xb;
      } while (lVar21 != -0xb);
      return;
    }
  } while( true );
}

Assistant:

void charpoly_danilevsky_piv(Eigen::MatrixBase<Derived> &A, double *p) {
	int n = A.rows();

	for (int i = n - 1; i > 0; i--) {

		int piv_ind = i - 1;
		double piv = std::abs(A(i, i - 1));

		// Find largest pivot
		for (int j = 0; j < i - 1; j++) {
			if (std::abs(A(i, j)) > piv) {
				piv = std::abs(A(i, j));
				piv_ind = j;
			}
		}
		if (piv_ind != i - 1) {
			// Perform permutation
			A.row(i - 1).swap(A.row(piv_ind));
			A.col(i - 1).swap(A.col(piv_ind));
		}
		piv = A(i, i - 1);

		Eigen::VectorXd v = A.row(i);
		A.row(i - 1) = v.transpose()*A;

		Eigen::VectorXd vinv = (-1.0)*v;
		vinv(i - 1) = 1;
		vinv /= piv;
		vinv(i - 1) -= 1;
		Eigen::VectorXd Acol = A.col(i - 1);
		for (int j = 0; j <= i; j++)
			A.row(j) = A.row(j) + Acol(j)*vinv.transpose();


		A.row(i) = Eigen::VectorXd::Zero(n);
		A(i, i - 1) = 1;
	}
	p[n] = 1;
	for (int i = 0; i < n; i++)
		p[i] = -A(0, n - i - 1);
}